

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O0

lzma_ret lzma_lz_decoder_init
                   (lzma_next_coder_conflict4 *next,lzma_allocator *allocator,
                   lzma_filter_info *filters,
                   _func_lzma_ret_lzma_lz_decoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr
                   *lz_init)

{
  lzma_coder_conflict5 *plVar1;
  uint8_t *puVar2;
  uint8_t *local_68;
  size_t offset;
  size_t copy_size;
  uint8_t *puStack_48;
  lzma_ret ret_;
  lzma_lz_options lz_options;
  _func_lzma_ret_lzma_lz_decoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr *lz_init_local;
  lzma_filter_info *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict4 *next_local;
  
  lz_options.preset_dict_size = (size_t)lz_init;
  if (next->coder == (lzma_coder_conflict5 *)0x0) {
    plVar1 = (lzma_coder_conflict5 *)lzma_alloc(0x10b0,allocator);
    next->coder = plVar1;
    if (next->coder == (lzma_coder_conflict5 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->code = lz_decode;
    next->end = lz_decoder_end;
    (next->coder->dict).buf = (uint8_t *)0x0;
    (next->coder->dict).size = 0;
    memcpy(&next->coder->lz,&LZMA_LZ_DECODER_INIT,0x28);
    memcpy(&next->coder->next,&LZMA_NEXT_CODER_INIT,0x40);
  }
  next_local._4_4_ =
       (*(code *)lz_options.preset_dict_size)
                 (&next->coder->lz,allocator,filters->options,&stack0xffffffffffffffb8);
  if (next_local._4_4_ == LZMA_OK) {
    if (puStack_48 < 0x1000) {
      puStack_48 = (uint8_t *)0x1000;
    }
    if (puStack_48 < 0xfffffffffffffff1) {
      puStack_48 = (uint8_t *)((long)puStack_48 + 0xfU & 0xfffffffffffffff0);
      if ((uint8_t *)(next->coder->dict).size != puStack_48) {
        lzma_free((next->coder->dict).buf,allocator);
        puVar2 = (uint8_t *)lzma_alloc((size_t)puStack_48,allocator);
        (next->coder->dict).buf = puVar2;
        if ((next->coder->dict).buf == (uint8_t *)0x0) {
          return LZMA_MEM_ERROR;
        }
        (next->coder->dict).size = (size_t)puStack_48;
      }
      lz_decoder_reset(next->coder);
      if ((lz_options.dict_size != 0) && (lz_options.preset_dict != (uint8_t *)0x0)) {
        if (lz_options.preset_dict < puStack_48) {
          local_68 = lz_options.preset_dict;
        }
        else {
          local_68 = puStack_48;
        }
        memcpy((next->coder->dict).buf,
               lz_options.preset_dict + (lz_options.dict_size - (long)local_68),(size_t)local_68);
        (next->coder->dict).pos = (size_t)local_68;
        (next->coder->dict).full = (size_t)local_68;
      }
      next->coder->next_finished = false;
      next->coder->this_finished = false;
      (next->coder->temp).pos = 0;
      (next->coder->temp).size = 0;
      next_local._4_4_ =
           lzma_next_filter_init((lzma_next_coder *)&next->coder->next,allocator,filters + 1);
    }
    else {
      next_local._4_4_ = LZMA_MEM_ERROR;
    }
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_lz_decoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter_info *filters,
		lzma_ret (*lz_init)(lzma_lz_decoder *lz,
			lzma_allocator *allocator, const void *options,
			lzma_lz_options *lz_options))
{
	lzma_lz_options lz_options;

	// Allocate the base structure if it isn't already allocated.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &lz_decode;
		next->end = &lz_decoder_end;

		next->coder->dict.buf = NULL;
		next->coder->dict.size = 0;
		next->coder->lz = LZMA_LZ_DECODER_INIT;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Allocate and initialize the LZ-based decoder. It will also give
	// us the dictionary size.
	return_if_error(lz_init(&next->coder->lz, allocator,
			filters[0].options, &lz_options));

	// If the dictionary size is very small, increase it to 4096 bytes.
	// This is to prevent constant wrapping of the dictionary, which
	// would slow things down. The downside is that since we don't check
	// separately for the real dictionary size, we may happily accept
	// corrupt files.
	if (lz_options.dict_size < 4096)
		lz_options.dict_size = 4096;

	// Make dictionary size a multipe of 16. Some LZ-based decoders like
	// LZMA use the lowest bits lzma_dict.pos to know the alignment of the
	// data. Aligned buffer is also good when memcpying from the
	// dictionary to the output buffer, since applications are
	// recommended to give aligned buffers to liblzma.
	//
	// Avoid integer overflow.
	if (lz_options.dict_size > SIZE_MAX - 15)
		return LZMA_MEM_ERROR;

	lz_options.dict_size = (lz_options.dict_size + 15) & ~((size_t)(15));

	// Allocate and initialize the dictionary.
	if (next->coder->dict.size != lz_options.dict_size) {
		lzma_free(next->coder->dict.buf, allocator);
		next->coder->dict.buf
				= lzma_alloc(lz_options.dict_size, allocator);
		if (next->coder->dict.buf == NULL)
			return LZMA_MEM_ERROR;

		next->coder->dict.size = lz_options.dict_size;
	}

	lz_decoder_reset(next->coder);

	// Use the preset dictionary if it was given to us.
	if (lz_options.preset_dict != NULL
			&& lz_options.preset_dict_size > 0) {
		// If the preset dictionary is bigger than the actual
		// dictionary, copy only the tail.
		const size_t copy_size = my_min(lz_options.preset_dict_size,
				lz_options.dict_size);
		const size_t offset = lz_options.preset_dict_size - copy_size;
		memcpy(next->coder->dict.buf, lz_options.preset_dict + offset,
				copy_size);
		next->coder->dict.pos = copy_size;
		next->coder->dict.full = copy_size;
	}

	// Miscellaneous initializations
	next->coder->next_finished = false;
	next->coder->this_finished = false;
	next->coder->temp.pos = 0;
	next->coder->temp.size = 0;

	// Initialize the next filter in the chain, if any.
	return lzma_next_filter_init(&next->coder->next, allocator,
			filters + 1);
}